

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_map.h
# Opt level: O0

void __thiscall
lemon::
ArrayMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_lemon::SmartDigraphBase::Arc>
::clear(ArrayMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_lemon::SmartDigraphBase::Arc>
        *this)

{
  bool bVar1;
  AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node>
  *in_RDI;
  int id;
  Item it;
  Notifier *nf;
  Item *in_stack_ffffffffffffffb8;
  Node local_30;
  Node local_2c;
  Notifier *local_28;
  long local_18;
  long local_10;
  undefined1 *local_8;
  
  local_28 = AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node>
             ::ObserverBase::notifier((ObserverBase *)in_RDI);
  if ((int)(in_RDI->_observers).
           super__List_base<lemon::AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node>::ObserverBase_*,_std::allocator<lemon::AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node>::ObserverBase_*>_>
           ._M_impl._M_node._M_size != 0) {
    SmartDigraphBase::Node::Node(&local_2c);
    AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node>
    ::first(in_RDI,in_stack_ffffffffffffffb8);
    while( true ) {
      SmartDigraphBase::Node::Node(&local_30);
      bVar1 = SmartDigraphBase::Node::operator!=(&local_2c,local_30);
      if (!bVar1) break;
      AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node>
      ::id(in_RDI,in_stack_ffffffffffffffb8);
      std::allocator_traits<std::allocator<lemon::SmartDigraphBase::Arc>_>::
      destroy<lemon::SmartDigraphBase::Arc>
                ((allocator_type *)in_RDI,(Arc *)in_stack_ffffffffffffffb8);
      AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node>
      ::next(in_RDI,in_stack_ffffffffffffffb8);
    }
    local_8 = (undefined1 *)((long)&(in_RDI->_lock)._lock + 8);
    local_10 = (in_RDI->_lock)._lock.__align;
    local_18 = (long)(int)(in_RDI->_observers).
                          super__List_base<lemon::AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node>::ObserverBase_*,_std::allocator<lemon::AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node>::ObserverBase_*>_>
                          ._M_impl._M_node._M_size;
    __gnu_cxx::new_allocator<lemon::SmartDigraphBase::Arc>::deallocate
              ((new_allocator<lemon::SmartDigraphBase::Arc> *)in_RDI,
               (Arc *)in_stack_ffffffffffffffb8,0x2c6944);
    *(undefined4 *)
     &(in_RDI->_observers).
      super__List_base<lemon::AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node>::ObserverBase_*,_std::allocator<lemon::AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node>::ObserverBase_*>_>
      ._M_impl._M_node._M_size = 0;
  }
  return;
}

Assistant:

virtual void clear() {
    Notifier* nf = Parent::notifier();
    if (capacity != 0) {
      Item it;
      for (nf->first(it); it != INVALID; nf->next(it)) {
        int id = nf->id(it);
        AllocatorTraits::destroy(allocator, &(values[id]));
      }
      allocator.deallocate(values, capacity);
      capacity = 0;
    }
  }